

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_trace.c
# Opt level: O3

parasail_result_t *
parasail_nw_trace(char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,
                 parasail_matrix_t *matrix)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  long lVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  parasail_result_t *ppVar8;
  int *ptr;
  int *ptr_00;
  int *ptr_01;
  int *ptr_02;
  int iVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  ulong size;
  int a;
  long lVar15;
  int iVar16;
  int iVar17;
  byte bVar18;
  int *piVar19;
  ulong size_00;
  
  if (_s2 == (char *)0x0) {
    parasail_nw_trace_cold_7();
  }
  else if (s2Len < 1) {
    parasail_nw_trace_cold_6();
  }
  else if (open < 0) {
    parasail_nw_trace_cold_5();
  }
  else if (gap < 0) {
    parasail_nw_trace_cold_4();
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    parasail_nw_trace_cold_3();
  }
  else {
    if (matrix->type == 0) {
      if (_s1 == (char *)0x0) {
        parasail_nw_trace_cold_2();
        return (parasail_result_t *)0x0;
      }
      uVar10 = (ulong)(uint)_s1Len;
      if (_s1Len < 1) {
        parasail_nw_trace_cold_1();
        return (parasail_result_t *)0x0;
      }
    }
    else {
      uVar10 = (ulong)(uint)matrix->length;
    }
    a = (int)uVar10;
    ppVar8 = parasail_result_new_trace(a,s2Len,0x10,1);
    if (ppVar8 != (parasail_result_t *)0x0) {
      ppVar8->flag = ppVar8->flag | 0x1480101;
      size = (ulong)(uint)s2Len;
      ptr = parasail_memalign_int(0x10,size);
      size_00 = (ulong)(s2Len + 1);
      ptr_00 = parasail_memalign_int(0x10,size_00);
      ptr_01 = parasail_memalign_int(0x10,size_00);
      if (ptr_01 != (int *)0x0 && (ptr_00 != (int *)0x0 && ptr != (int *)0x0)) {
        piVar19 = ((ppVar8->field_4).rowcols)->score_row;
        if (matrix->type == 0) {
          ptr_02 = parasail_memalign_int(0x10,(long)a);
          if (ptr_02 == (int *)0x0) {
            return (parasail_result_t *)0x0;
          }
          if (0 < a) {
            piVar2 = matrix->mapper;
            uVar13 = 0;
            do {
              ptr_02[uVar13] = piVar2[(byte)_s1[uVar13]];
              uVar13 = uVar13 + 1;
            } while (uVar10 != uVar13);
          }
        }
        else {
          ptr_02 = (int *)0x0;
        }
        piVar2 = matrix->mapper;
        uVar10 = 0;
        do {
          ptr[uVar10] = piVar2[(byte)_s2[uVar10]];
          uVar10 = uVar10 + 1;
        } while (size != uVar10);
        *ptr_00 = 0;
        *ptr_01 = -0x40000000;
        iVar6 = -open;
        uVar10 = 1;
        do {
          ptr_00[uVar10] = iVar6;
          ptr_01[uVar10] = -0x40000000;
          uVar10 = uVar10 + 1;
          iVar6 = iVar6 - gap;
        } while (size_00 != uVar10);
        if (0 < a) {
          uVar10 = 1;
          do {
            iVar6 = matrix->size;
            lVar4 = uVar10 - 1;
            if (matrix->type == 0) {
              lVar4 = (long)ptr_02[uVar10 - 1];
            }
            piVar2 = matrix->matrix;
            iVar17 = *ptr_00;
            iVar11 = -((int)(uVar10 - 1) * gap + open);
            *ptr_00 = iVar11;
            iVar14 = -0x40000000;
            lVar15 = 0;
            do {
              iVar1 = ptr_00[lVar15 + 1];
              iVar9 = iVar1 - open;
              iVar7 = ptr_01[lVar15 + 1] - gap;
              iVar3 = iVar7;
              if (iVar7 < iVar9) {
                iVar3 = iVar9;
              }
              ptr_01[lVar15 + 1] = iVar3;
              iVar12 = iVar11 - open;
              iVar16 = iVar14 - gap;
              iVar14 = iVar12;
              if (iVar12 <= iVar16) {
                iVar14 = iVar16;
              }
              iVar17 = iVar17 + piVar2[iVar6 * lVar4 + (long)ptr[lVar15]];
              iVar11 = iVar14;
              if (iVar14 < iVar17) {
                iVar11 = iVar17;
              }
              if (iVar11 <= iVar3) {
                iVar11 = iVar3;
              }
              ptr_00[lVar15 + 1] = iVar11;
              bVar18 = ((iVar9 <= iVar7) << 5 | (iVar12 <= iVar16) << 3) + 0x28;
              *(byte *)((long)piVar19 + lVar15) = bVar18;
              bVar5 = 4;
              if (iVar11 != iVar17) {
                bVar5 = (iVar11 == ptr_01[lVar15 + 1]) + 1;
              }
              *(byte *)((long)piVar19 + lVar15) = bVar5 | bVar18;
              lVar15 = lVar15 + 1;
              iVar17 = iVar1;
            } while (size_00 - 1 != lVar15);
            uVar10 = uVar10 + 1;
            piVar19 = (int *)((long)piVar19 + size);
          } while (uVar10 != a + 1);
        }
        ppVar8->score = ptr_00[size];
        ppVar8->end_query = a + -1;
        ppVar8->end_ref = s2Len + -1;
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        if (matrix->type == 0) {
          parasail_free(ptr_02);
          return ppVar8;
        }
        return ppVar8;
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* ENAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    parasail_result_t *result = NULL;
    int * restrict s1 = NULL;
    int * restrict s2 = NULL;
    int * restrict H = NULL;
    int * restrict F = NULL;
    int8_t * restrict HT = NULL;
    int i = 0;
    int j = 0;
    int s1Len = 0;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;

    /* initialize result */
    result = parasail_result_new_trace(s1Len, s2Len, 16, sizeof(int8_t));
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_NOVEC | PARASAIL_FLAG_TRACE
        | PARASAIL_FLAG_BITS_INT | PARASAIL_FLAG_LANES_1;

    /* initialize heap variables */
    s2 = parasail_memalign_int(16, s2Len);
    H = parasail_memalign_int(16, s2Len+1);
    F = parasail_memalign_int(16, s2Len+1);
    HT = (int8_t* const restrict)result->trace->trace_table;

    /* validate heap variables */
    if (!s2) return NULL;
    if (!H) return NULL;
    if (!F) return NULL;

    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int(16, s1Len);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
    }
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }

    /* upper left corner */
    H[0] = 0;
    F[0] = NEG_INF_32;
    
    /* first row */
    for (j=1; j<=s2Len; ++j) {
        H[j] = -open -(j-1)*gap;
        F[j] = NEG_INF_32;
    }

    /* iter over first sequence */
    for (i=1; i<=s1Len; ++i) {
        const int * const restrict matrow =
            matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
            &matrix->matrix[matrix->size*s1[i-1]] :
            &matrix->matrix[matrix->size*(i-1)];
        /* init first column */
        int NH = H[0];
        int WH = -open - (i-1)*gap;
        int E = NEG_INF_32;
        H[0] = WH;
        for (j=1; j<=s2Len; ++j) {
            int H_dag;
            int E_opn;
            int E_ext;
            int F_opn;
            int F_ext;
            int NWH = NH;
            NH = H[j];
            F_opn = NH - open;
            F_ext = F[j] - gap;
            F[j] = MAX(F_opn, F_ext);
            E_opn = WH - open;
            E_ext = E    - gap;
            E    = MAX(E_opn, E_ext);
            H_dag = NWH + matrow[s2[j-1]];
            WH = MAX(H_dag, E);
            WH = MAX(WH, F[j]);
            H[j] = WH;
            HT[1LL*(i-1)*s2Len + (j-1)] = (F_opn > F_ext) ? PARASAIL_DIAG_F
                                                          : PARASAIL_DEL_F;
            HT[1LL*(i-1)*s2Len + (j-1)] |= (E_opn > E_ext) ? PARASAIL_DIAG_E
                                                           : PARASAIL_INS_E;
            HT[1LL*(i-1)*s2Len + (j-1)] |= (WH == H_dag) ? PARASAIL_DIAG
                                        : (WH == F[j])   ? PARASAIL_DEL
                                                         : PARASAIL_INS;
        }
    }

    result->score = H[s2Len];
    result->end_query = s1Len-1;
    result->end_ref = s2Len-1;

    parasail_free(F);
    parasail_free(H);
    parasail_free(s2);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}